

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_datatype_from_string(char *name)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char **ppcVar4;
  
  if (name == (char *)0x0) {
    return 0;
  }
  ppcVar4 = &nifti_type_list[0x2a].name;
  uVar3 = 0x2a;
  do {
    iVar2 = strcmp(name,*ppcVar4);
    if (iVar2 == 0) goto LAB_0011295a;
    ppcVar4 = ppcVar4 + -3;
    bVar1 = 1 < uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar1);
  uVar3 = 0;
LAB_0011295a:
  return nifti_type_list[(int)uVar3].type;
}

Assistant:

int nifti_datatype_from_string( const char * name )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    if( !name ) return DT_UNKNOWN;

    for( c = tablen-1; c > 0; c-- )
        if( !strcmp(name, nifti_type_list[c].name) )
            break;

    return nifti_type_list[c].type;
}